

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3f __thiscall pbrt::DirectionCone::ClosestVectorInCone(DirectionCone *this,Vector3f wp)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  type tVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [60];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Vector3<float> VVar19;
  Vector3f VVar20;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  Tuple3<pbrt::Vector3,_float> local_28;
  
  auVar12 = wp._12_60_;
  local_58.z = wp.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._8_56_ = wp._8_56_;
  auVar8._0_8_ = wp.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_58._0_8_ = vmovlps_avx(auVar8._0_16_);
  VVar19 = Normalize<float>((Vector3<float> *)&local_58);
  auVar11._0_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._4_60_ = auVar12;
  auVar9._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar8._8_56_;
  auVar7 = auVar9._0_16_;
  local_58._0_8_ = vmovlps_avx(auVar7);
  auVar13 = vmovshdup_avx(auVar7);
  fVar1 = this->cosTheta;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ *
                                          (this->w).super_Tuple3<pbrt::Vector3,_float>.y)),auVar7,
                            ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar13 = vfmadd231ss_fma(auVar13,auVar11._0_16_,
                            ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.z));
  if (auVar13._0_4_ <= fVar1) {
    auVar13 = vfnmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),ZEXT416(0x3f800000));
    auVar13 = vmaxss_avx(auVar13,ZEXT816(0) << 0x40);
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    local_48 = vxorps_avx512vl(auVar13,auVar7);
    auVar8._8_56_ = ZEXT856(local_48._8_8_);
    local_58.z = auVar11._0_4_;
    VVar19 = Cross<float>((Vector3<float> *)&local_58,&this->w);
    local_28.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar8._8_56_;
    local_28._0_8_ = vmovlps_avx(auVar10._0_16_);
    auVar9._0_8_ = 0;
    VVar19 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,float> *)this,this->cosTheta);
    local_38 = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    uStack_30 = auVar9._0_8_;
    tVar5 = Length<float>((Vector3<float> *)&local_28);
    fVar1 = (this->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar2._0_4_ = (this->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar2._4_4_ = (this->w).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar2;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = local_58.x;
    auVar17._4_4_ = local_58.y;
    fVar6 = (float)local_48._0_4_ / tVar5;
    fVar3 = fVar1 * fVar1;
    auVar18._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar2;
    auVar18._4_4_ = (float)uVar2._4_4_ * (float)uVar2._4_4_;
    auVar18._8_8_ = 0;
    auVar13 = vshufps_avx(auVar18,auVar18,0xe1);
    fVar4 = local_58.z * fVar1;
    auVar15._0_4_ = (auVar13._0_4_ + fVar3) * local_58.x;
    auVar15._4_4_ = (auVar13._4_4_ + fVar3) * local_58.y;
    auVar15._8_4_ = (auVar13._8_4_ + fVar3) * 0.0;
    auVar15._12_4_ = (auVar13._12_4_ + fVar3) * 0.0;
    auVar13._4_4_ = fVar4;
    auVar13._0_4_ = fVar4;
    auVar13._8_4_ = fVar4;
    auVar13._12_4_ = fVar4;
    auVar13 = vfmadd231ps_fma(auVar13,auVar17,auVar16);
    auVar13 = vshufps_avx(auVar13,auVar13,0xe1);
    auVar15 = vfmsub231ps_fma(auVar15,auVar16,auVar13);
    auVar14._0_4_ = local_58.x * (float)(undefined4)uVar2;
    auVar14._4_4_ = local_58.y * (float)uVar2._4_4_;
    auVar14._8_8_ = 0;
    auVar13 = vmovshdup_avx(auVar14);
    auVar7 = vfmadd231ss_fma(auVar13,auVar17,auVar16);
    auVar13 = vhaddps_avx(auVar18,auVar18);
    auVar13 = vfmsub231ss_fma(ZEXT416((uint)(auVar13._0_4_ * local_58.z)),ZEXT416((uint)fVar1),
                              auVar7);
    auVar9._0_8_ = CONCAT44(fVar6 * auVar15._4_4_ + local_38._4_4_,
                            fVar6 * auVar15._0_4_ + (float)local_38);
    auVar11 = ZEXT464((uint)(fVar6 * auVar13._0_4_ + VVar19.super_Tuple3<pbrt::Vector3,_float>.z));
  }
  VVar20.super_Tuple3<pbrt::Vector3,_float>.z = auVar11._0_4_;
  VVar20.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar9._0_8_;
  VVar20.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
  return (Vector3f)VVar20.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

DirectionCone::ClosestVectorInCone(Vector3f wp) const {
    DCHECK(!empty);
    wp = Normalize(wp);
    // Return provided vector if it is inside the cone
    if (Dot(wp, w) > cosTheta)
        return wp;

    // Find closest vector by rotating _wp_ until it touches the cone
    Float sinTheta = -SafeSqrt(1 - cosTheta * cosTheta);
    Vector3f a = Cross(wp, w);
    return cosTheta * w +
           (sinTheta / Length(a)) *
               Vector3f(w.x * (wp.y * w.y + wp.z * w.z) - wp.x * (Sqr(w.y) + Sqr(w.z)),
                        w.y * (wp.x * w.x + wp.z * w.z) - wp.y * (Sqr(w.x) + Sqr(w.z)),
                        w.z * (wp.x * w.x + wp.y * w.y) - wp.z * (Sqr(w.x) + Sqr(w.y)));
}